

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser_test.cc
# Opt level: O0

void __thiscall
ParserTestMultipleOutputs::ParserTestMultipleOutputs(ParserTestMultipleOutputs *this)

{
  ParserTestMultipleOutputs *this_local;
  
  ParserTest::ParserTest(&this->super_ParserTest);
  (this->super_ParserTest).super_Test._vptr_Test =
       (_func_int **)&PTR__ParserTestMultipleOutputs_002a7e88;
  return;
}

Assistant:

TEST_F(ParserTest, MultipleOutputs) {
  State local_state;
  ManifestParser parser(&local_state, NULL);
  string err;
  EXPECT_TRUE(parser.ParseTest("rule cc\n  command = foo\n  depfile = bar\n"
                               "build a.o b.o: cc c.cc\n",
                               &err));
  EXPECT_EQ("", err);
}